

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int planandnavigate2d(PlannerType plannerType,char *envCfgFilename)

{
  bool bVar1;
  FILE *__stream;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  ARAPlanner *this;
  ADPlanner *this_00;
  RSTARPlanner *this_01;
  anaPlanner *this_02;
  clock_t cVar7;
  size_type sVar8;
  uint *puVar9;
  reference pvVar10;
  undefined4 in_EDI;
  double dVar11;
  int newy_1;
  int newx_1;
  int newy;
  int newx;
  int j;
  bool bOnthePath;
  int index_1;
  int goalindex;
  int startindex;
  double plantime_secs;
  bool bPlanExists;
  double TimeStarted;
  uchar truecost;
  int index;
  int y_1;
  int x_1;
  int dY;
  int dX;
  bool bChanges;
  int goalthresh;
  SBPLPlanner *planner;
  bool bforwardsearch;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  uchar *map;
  int plantime_below0p05secs;
  int plantime_over0p05secs;
  int plantime_over0p1secs;
  int plantime_over0p5secs;
  int plantime_over1secs;
  uchar obsthresh;
  sbpl_2Dcell_t nav2dcell;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> changedcellsV;
  vector<int,_std::allocator<int>_> preds_of_changededgesIDV;
  int y;
  int x;
  bool bPrint;
  FILE *fSol;
  char *sol;
  int goaly;
  int goalx;
  int starty;
  int startx;
  int size_y;
  int size_x;
  EnvironmentNAV2D trueenvironment_nav2D;
  EnvironmentNAV2D environment_nav2D;
  MDPConfig MDPCfg;
  double allocated_time_secs_foreachplan;
  char *in_stack_fffffffffffff8a8;
  int *piVar12;
  undefined4 uVar13;
  string *what_arg;
  SBPL_Exception *in_stack_fffffffffffff8b0;
  byte *pbVar14;
  undefined4 uVar15;
  SBPL_Exception *this_03;
  undefined4 in_stack_fffffffffffff8bc;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff8c0;
  ARAPlanner *in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  long local_6c8;
  long local_6b8;
  uint local_5ec;
  uint local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  byte local_5d5;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  double local_5c8;
  undefined1 local_5ba;
  byte local_591;
  double local_590;
  char local_585;
  int local_584;
  uint local_580;
  uint local_57c;
  int local_578;
  int local_574;
  byte local_56d;
  int local_56c;
  ARAPlanner *local_568;
  byte local_559;
  vector<int,_std::allocator<int>_> local_558;
  void *local_540;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528;
  byte local_521;
  sbpl_2Dcell_t local_520;
  vector local_518 [24];
  undefined1 local_500 [28];
  int local_4e4;
  int local_4e0;
  byte local_4d9;
  FILE *local_4d8;
  char *local_4d0;
  int local_4c4;
  int local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  int local_4b0 [4];
  EnvironmentNAV2D local_4a0 [576];
  _IO_FILE local_260 [2];
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_4;
  
  local_18 = 0x3fc999999999999a;
  local_4 = in_EDI;
  EnvironmentNAV2D::EnvironmentNAV2D((EnvironmentNAV2D *)local_260);
  EnvironmentNAV2D::EnvironmentNAV2D(local_4a0);
  local_4b0[0] = -1;
  local_4b4 = 0xffffffff;
  local_4b8 = 0;
  local_4bc = 0;
  local_4c0 = -1;
  local_4c4 = -1;
  local_4d0 = "sol.txt";
  local_4d8 = fopen("sol.txt","w");
  if (local_4d8 == (FILE *)0x0) {
    uVar6 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_4d9 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10f115);
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x10f122);
  sbpl_2Dcell_t::sbpl_2Dcell_t(&local_520);
  local_521 = 0;
  srand(0);
  local_528 = 0;
  local_52c = 0;
  local_530 = 0;
  local_534 = 0;
  local_538 = 0;
  bVar2 = EnvironmentNAV2D::SetEnvParameter((char *)local_4a0,0x118b6a);
  if ((bVar2 & 1) == 0) {
    uVar6 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar2 = EnvironmentNAV2D::SetEnvParameter((char *)local_260,0x118b6a);
  if ((bVar2 & 1) == 0) {
    uVar6 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar2 = EnvironmentNAV2D::InitializeEnv((char *)local_4a0);
  if ((bVar2 & 1) != 0) {
    pbVar14 = &local_521;
    piVar12 = &local_4c4;
    EnvironmentNAV2D::GetEnvParms
              ((int *)local_4a0,local_4b0,(int *)&local_4b4,(int *)&local_4b8,(int *)&local_4bc,
               &local_4c0,(uchar *)piVar12);
    local_540 = calloc((long)(int)(local_4b0[0] * local_4b4),1);
    if ((local_4d9 & 1) != 0) {
      printf("true map:\n");
    }
    local_4e4 = 0;
    while( true ) {
      uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
      uVar15 = (undefined4)((ulong)pbVar14 >> 0x20);
      if ((local_4d9 & 1) == 0 || (int)local_4b4 <= local_4e4) break;
      for (local_4e0 = 0; local_4e0 < local_4b0[0]; local_4e0 = local_4e0 + 1) {
        bVar2 = EnvironmentNAV2D::IsObstacle((int)local_4a0,local_4e0);
        printf("%d ",(ulong)(bVar2 & 1));
      }
      printf("\n");
      local_4e4 = local_4e4 + 1;
    }
    if ((local_4d9 & 1) != 0) {
      uVar3 = system("pause");
      printf("System Pause (return=%d)\n",(ulong)uVar3);
    }
    uVar3 = (uint)local_521;
    this_03 = (SBPL_Exception *)CONCAT44(uVar15,local_4c4);
    what_arg = (string *)CONCAT44(uVar13,local_4c0);
    bVar2 = EnvironmentNAV2D::InitializeEnv
                      ((int)local_260,local_4b0[0],(uchar *)(ulong)local_4b4,(int)local_540,
                       local_4b8,local_4bc,local_4c0,(uchar)local_4c4);
    if ((bVar2 & 1) == 0) {
      uVar6 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(this_03,(char *)what_arg);
      __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    bVar2 = EnvironmentNAV2D::InitializeMDPCfg((MDPConfig *)local_260);
    if ((bVar2 & 1) == 0) {
      uVar6 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(this_03,(char *)what_arg);
      __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10f687);
    local_559 = 0;
    local_568 = (ARAPlanner *)0x0;
    switch(local_4) {
    case 0:
      printf("Initializing ADPlanner...\n");
      this_00 = (ADPlanner *)operator_new(0x98);
      ADPlanner::ADPlanner(this_00,(DiscreteSpaceInformation *)local_260,(bool)(local_559 & 1));
      local_568 = (ARAPlanner *)this_00;
      break;
    case 1:
      printf("Initializing ARAPlanner...\n");
      this = (ARAPlanner *)operator_new(0xa0);
      ARAPlanner::ARAPlanner(this,(DiscreteSpaceInformation *)local_260,(bool)(local_559 & 1));
      local_568 = this;
      break;
    default:
      printf("Invalid planner type\n");
      break;
    case 3:
      printf("Initializing RSTARPlanner...\n");
      this_01 = (RSTARPlanner *)operator_new(0x68);
      RSTARPlanner::RSTARPlanner
                (this_01,(DiscreteSpaceInformation *)local_260,(bool)(local_559 & 1));
      local_568 = (ARAPlanner *)this_01;
      break;
    case 5:
      printf("Initializing anaPlanner...\n");
      this_02 = (anaPlanner *)operator_new(0x48);
      anaPlanner::anaPlanner(this_02,(DiscreteSpaceInformation *)local_260,(bool)(local_559 & 1));
      local_568 = (ARAPlanner *)this_02;
    }
    (**(code **)(*(long *)local_568 + 0x90))(0x4000000000000000);
    iVar4 = (**(code **)(*(long *)local_568 + 0x28))(local_568,local_20);
    if (iVar4 != 0) {
      iVar4 = (**(code **)(*(long *)local_568 + 0x20))(local_568,local_1c);
      if (iVar4 == 0) {
        printf("ERROR: failed to set goal state\n");
        uVar6 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(this_03,(char *)what_arg);
        __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      (**(code **)(*(long *)local_568 + 0x40))(local_568,0);
      local_56c = 0;
      do {
        do {
          iVar4 = local_4b8 - local_4c0;
          if (iVar4 < 1) {
            iVar4 = -iVar4;
          }
          bVar1 = true;
          if (iVar4 <= local_56c) {
            iVar4 = local_4bc - local_4c4;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            bVar1 = local_56c < iVar4;
          }
          if (!bVar1) {
            printf("stats: plantimes over 1 secs=%d; over 0.5 secs=%d; over 0.1 secs=%d; over 0.05 secs=%d; below 0.05 secs=%d\n"
                   ,(ulong)local_528,(ulong)local_52c,(ulong)local_530,(ulong)local_534,
                   (ulong)local_538);
            fprintf(local_4d8,
                    "stats: plantimes over 1 secs=%d; over 0.5; secs=%d; over 0.1 secs=%d; over 0.05 secs=%d; below 0.05 secs=%d\n"
                    ,(ulong)local_528,(ulong)local_52c,(ulong)local_530,(ulong)local_534,
                    CONCAT44((int)((ulong)what_arg >> 0x20),local_538));
            if ((local_4d9 & 1) != 0) {
              uVar3 = system("pause");
              printf("System Pause (return=%d)\n",(ulong)uVar3);
            }
            fflush((FILE *)0x0);
            fclose(local_4d8);
            if (local_568 != (ARAPlanner *)0x0) {
              (**(code **)(*(long *)local_568 + 0xa0))();
            }
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff8c0);
            std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector
                      ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                       in_stack_fffffffffffff8c0);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff8c0);
            EnvironmentNAV2D::~EnvironmentNAV2D(local_4a0);
            EnvironmentNAV2D::~EnvironmentNAV2D((EnvironmentNAV2D *)local_260);
            return 1;
          }
          local_56d = 0;
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)0x10fb0e);
          std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
                    ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x10fb1b);
          local_578 = 0;
          for (local_574 = -2; local_574 < 3; local_574 = local_574 + 1) {
            for (local_578 = -2; local_578 < 3; local_578 = local_578 + 1) {
              local_57c = local_4b8 + local_574;
              local_580 = local_4bc + local_578;
              if ((((-1 < (int)local_57c) && ((int)local_57c < local_4b0[0])) &&
                  (-1 < (int)local_580)) && ((int)local_580 < (int)local_4b4)) {
                local_584 = local_57c + local_580 * local_4b0[0];
                local_585 = EnvironmentNAV2D::GetMapCost((int)local_4a0,local_57c);
                if (*(char *)((long)local_540 + (long)local_584) != local_585) {
                  *(char *)((long)local_540 + (long)local_584) = local_585;
                  EnvironmentNAV2D::UpdateCost((int)local_260,local_57c,(uchar)local_580);
                  printf("setting cost[%d][%d] to %d\n",(ulong)local_57c,(ulong)local_580,
                         (ulong)*(byte *)((long)local_540 + (long)local_584));
                  local_56d = 1;
                  local_520.x = local_57c;
                  local_520.y = local_580;
                  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::push_back
                            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                             in_stack_fffffffffffff8c0,
                             (value_type *)CONCAT44(in_stack_fffffffffffff8bc,uVar3));
                }
              }
            }
          }
          cVar7 = clock();
          local_590 = (double)cVar7;
          if ((local_56d & 1) != 0) {
            if (local_568 == (ARAPlanner *)0x0) {
              local_6b8 = 0;
            }
            else {
              local_6b8 = __dynamic_cast(local_568,&SBPLPlanner::typeinfo,&ARAPlanner::typeinfo,0);
            }
            if (local_6b8 == 0) {
              if (local_568 == (ARAPlanner *)0x0) {
                local_6c8 = 0;
              }
              else {
                local_6c8 = __dynamic_cast(local_568,&SBPLPlanner::typeinfo,&ADPlanner::typeinfo,0);
              }
              if (local_6c8 != 0) {
                EnvironmentNAV2D::GetPredsofChangedEdges((vector *)local_260,local_518);
                (**(code **)(*(long *)local_568 + 0xb0))(local_568,local_500);
              }
            }
            else {
              (**(code **)(*(long *)local_568 + 0xa8))();
            }
          }
          fprintf(local_4d8,"%d %d ",(ulong)local_4b8,(ulong)local_4bc);
          local_591 = 0;
          while ((local_591 & 1) == 0) {
            printf("new planning...\n");
            iVar4 = (*(code *)**(undefined8 **)local_568)(local_18,local_568,&local_558);
            local_591 = iVar4 == 1;
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_558);
            printf("done with the solution of size=%d\n",sVar8 & 0xffffffff);
            EnvironmentNAV2D::PrintTimeStat(local_260);
            if ((local_591 & 1) == 0) {
              local_5ba = 1;
              uVar6 = __cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff8f0,
                         (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         (allocator<char> *)in_stack_fffffffffffff8e0);
              SBPL_Exception::SBPL_Exception(this_03,what_arg);
              local_5ba = 0;
              __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
            }
          }
          cVar7 = clock();
          __stream = local_4d8;
          dVar11 = ((double)cVar7 - local_590) / 1000000.0;
          local_5c8 = dVar11;
          uVar6 = (**(code **)(*(long *)local_568 + 0x50))();
          fprintf(__stream,"%.5f %.5f\n",dVar11,uVar6);
          fflush(local_4d8);
          if (local_5c8 <= 1.0) {
            if (local_5c8 <= 0.5) {
              if (local_5c8 <= 0.1) {
                if (local_5c8 <= 0.05) {
                  local_538 = local_538 + 1;
                }
                else {
                  local_534 = local_534 + 1;
                }
              }
              else {
                local_530 = local_530 + 1;
              }
            }
            else {
              local_52c = local_52c + 1;
            }
          }
          else {
            local_528 = local_528 + 1;
          }
          local_5cc = local_4b8 + local_4bc * local_4b0[0];
          local_5d0 = local_4c0 + local_4c4 * local_4b0[0];
          for (local_4e4 = 0; (local_4d9 & 1) != 0 && local_4e4 < (int)local_4b4;
              local_4e4 = local_4e4 + 1) {
            for (local_4e0 = 0; local_4e0 < local_4b0[0]; local_4e0 = local_4e0 + 1) {
              local_5d4 = local_4e0 + local_4e4 * local_4b0[0];
              local_5d5 = 0;
              for (local_5dc = 1; iVar4 = local_5dc,
                  sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_558),
                  iVar4 < (int)sVar8; local_5dc = local_5dc + 1) {
                puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                           (&local_558,(long)local_5dc);
                EnvironmentNAV2D::GetCoordFromState((int)local_260,(int *)(ulong)*puVar9,&local_5e0)
                ;
                if ((local_4e0 == local_5e0) && (local_4e4 == local_5e4)) {
                  local_5d5 = 1;
                }
              }
              if (((local_5d4 == local_5cc) || (local_5d4 == local_5d0)) || ((local_5d5 & 1) != 0))
              {
                if (local_5d4 == local_5cc) {
                  printf("  R ");
                }
                else if (local_5d4 == local_5d0) {
                  printf("  G ");
                }
                else if ((local_5d5 & 1) == 0) {
                  printf("  ? ");
                }
                else {
                  printf("  * ");
                }
              }
              else {
                printf("%3d ",(ulong)*(byte *)((long)local_540 + (long)local_5d4));
              }
            }
            printf("\n");
          }
          if ((local_4d9 & 1) != 0) {
            uVar5 = system("pause");
            printf("System Pause (return=%d)\n",(ulong)uVar5);
          }
        } while (((local_591 & 1) == 0) ||
                (sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_558), (int)sVar8 < 2));
        puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_558,1);
        EnvironmentNAV2D::GetCoordFromState((int)local_260,(int *)(ulong)*puVar9,(int *)&local_5e8);
        bVar2 = EnvironmentNAV2D::GetMapCost((int)local_4a0,local_5e8);
        if (local_521 <= bVar2) {
          uVar6 = __cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(this_03,(char *)what_arg);
          __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
        }
        printf("moving from %d %d to %d %d\n",(ulong)local_4b8,(ulong)local_4bc,(ulong)local_5e8,
               (ulong)local_5ec);
        local_4b8 = local_5e8;
        local_4bc = local_5ec;
        EnvironmentNAV2D::SetStart((int)local_260,local_5e8);
        in_stack_fffffffffffff8e0 = local_568;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_558,1);
        in_stack_fffffffffffff8ec =
             (**(code **)(*(long *)in_stack_fffffffffffff8e0 + 0x28))
                       (in_stack_fffffffffffff8e0,*pvVar10);
      } while (in_stack_fffffffffffff8ec != 0);
      uVar6 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(this_03,(char *)what_arg);
      __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    printf("ERROR: failed to set start state\n");
    uVar6 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_03,(char *)what_arg);
    __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  uVar6 = __cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  __cxa_throw(uVar6,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
}

Assistant:

int planandnavigate2d(PlannerType plannerType, char* envCfgFilename)
{
    double allocated_time_secs_foreachplan = 0.2; //in seconds
    MDPConfig MDPCfg;
    EnvironmentNAV2D environment_nav2D;
    EnvironmentNAV2D trueenvironment_nav2D;
    int size_x = -1, size_y = -1;
    int startx = 0, starty = 0;
    int goalx = -1, goaly = -1;
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    //int dx[8] = {-1, -1, -1,  0,  0,  1,  1,  1};
    //int dy[8] = {-1,  0,  1, -1,  1, -1,  0,  1};
    bool bPrint = false;
    int x, y;
    vector<int> preds_of_changededgesIDV;
    vector<nav2dcell_t> changedcellsV;
    nav2dcell_t nav2dcell;
    unsigned char obsthresh = 0;
    srand(0);
    int plantime_over1secs = 0, plantime_over0p5secs = 0, plantime_over0p1secs = 0, plantime_over0p05secs = 0,
        plantime_below0p05secs = 0;

    //set parameters - should be done before initialization
    if (!trueenvironment_nav2D.SetEnvParameter("is16connected", 1)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }
    if (!environment_nav2D.SetEnvParameter("is16connected", 1)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }

    //initialize true map and robot map
    if (!trueenvironment_nav2D.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }
    trueenvironment_nav2D.GetEnvParms(&size_x, &size_y, &startx, &starty, &goalx, &goaly, &obsthresh);
    unsigned char* map = (unsigned char*)calloc(size_x * size_y, sizeof(unsigned char));

    //print the map
    if (bPrint) printf("true map:\n");
    for (y = 0; bPrint && y < size_y; y++) {
        for (x = 0; x < size_x; x++) {
            printf("%d ", (int)trueenvironment_nav2D.IsObstacle(x, y));
        }
        printf("\n");
    }
    if (bPrint) printf("System Pause (return=%d)\n", system("pause"));

    //Initialize Environment (should be called before initializing anything else)
    if (!environment_nav2D.InitializeEnv(size_x, size_y, map, startx, starty, goalx, goaly, obsthresh)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_nav2D.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //create a planner
    vector<int> solution_stateIDs_V;
    bool bforwardsearch = false;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_nav2D, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    planner->set_initialsolution_eps(2.0);

    //set the start and goal configurations
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    //set search mode
    planner->set_search_mode(false);

    //now comes the main loop
    int goalthresh = 0;
    while (abs(startx - goalx) > goalthresh || abs(starty - goaly) > goalthresh) {

        //simulate sensor data update
        bool bChanges = false;
        preds_of_changededgesIDV.clear();
        changedcellsV.clear();

        int dX = 0;
        int dY = 0;
        for (dX = -2; dX <= 2; dX++) {
            for (dY = -2; dY <= 2; dY++) {
                int x = startx + dX;
                int y = starty + dY;
                if (x < 0 || x >= size_x || y < 0 || y >= size_y) {
                    continue;
                }
                int index = x + y * size_x;
                unsigned char truecost = trueenvironment_nav2D.GetMapCost(x, y);
                if (map[index] != truecost) {
                    map[index] = truecost;
                    environment_nav2D.UpdateCost(x, y, map[index]);
                    printf("setting cost[%d][%d] to %d\n", x, y, map[index]);
                    bChanges = true;
                    // store the changed cells
                    nav2dcell.x = x;
                    nav2dcell.y = y;
                    changedcellsV.push_back(nav2dcell);
                }
            }
        }

        double TimeStarted = clock();

        if (bChanges) {
            if (dynamic_cast<ARAPlanner*> (planner) != NULL) {
                ((ARAPlanner*)planner)->costs_changed(); //use by ARA* planner (non-incremental)
            }
            else if (dynamic_cast<ADPlanner*> (planner) != NULL) {
                //get the affected states
                environment_nav2D.GetPredsofChangedEdges(&changedcellsV, &preds_of_changededgesIDV);
                //let know the incremental planner about them
                ((ADPlanner*)planner)->update_preds_of_changededges(&preds_of_changededgesIDV);
            }
        }
        //planner.force_planning_from_scratch();

        fprintf(fSol, "%d %d ", startx, starty);

        //plan a path
        bool bPlanExists = false;
        while (bPlanExists == false) {
            printf("new planning...\n");
            bPlanExists = (planner->replan(allocated_time_secs_foreachplan, &solution_stateIDs_V) == 1);
            printf("done with the solution of size=%d\n", (unsigned int)solution_stateIDs_V.size());
            environment_nav2D.PrintTimeStat(stdout);
            if (bPlanExists == false) {
                throw SBPL_Exception();
            }

            //for(unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
            //environment_nav2D.PrintState(solution_stateIDs_V[i], true, fSol);
            //}
            //fprintf(fSol, "*********\n");
        }

        double plantime_secs = (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC);
        fprintf(fSol, "%.5f %.5f\n", plantime_secs, planner->get_solution_eps());
        fflush(fSol);
        if (plantime_secs > 1.0)
            plantime_over1secs++;
        else if (plantime_secs > 0.5)
            plantime_over0p5secs++;
        else if (plantime_secs > 0.1)
            plantime_over0p1secs++;
        else if (plantime_secs > 0.05)
            plantime_over0p05secs++;
        else
            plantime_below0p05secs++;

        //print the map
        int startindex = startx + starty * size_x;
        int goalindex = goalx + goaly * size_x;
        for (y = 0; bPrint && y < size_y; y++) {
            for (x = 0; x < size_x; x++) {
                int index = x + y * size_x;

                //check to see if it is on the path
                bool bOnthePath = false;
                for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
                    int newx, newy;
                    environment_nav2D.GetCoordFromState(solution_stateIDs_V[j], newx, newy);
                    if (x == newx && y == newy) bOnthePath = true;
                }

                if (index != startindex && index != goalindex && !bOnthePath)
                    printf("%3d ", map[index]);
                else if (index == startindex)
                    printf("  R ");
                else if (index == goalindex)
                    printf("  G ");
                else if (bOnthePath)
                    printf("  * ");
                else
                    printf("  ? ");
            }
            printf("\n");
        }
        if (bPrint) printf("System Pause (return=%d)\n", system("pause"));

        //move along the path
        if (bPlanExists && (int)solution_stateIDs_V.size() > 1) {
            //get coord of the successor
            int newx, newy;
            environment_nav2D.GetCoordFromState(solution_stateIDs_V[1], newx, newy);

            if (trueenvironment_nav2D.GetMapCost(newx, newy) >= obsthresh) {
                throw SBPL_Exception("ERROR: robot is commanded to move into an obstacle");
            }

            //move
            printf("moving from %d %d to %d %d\n", startx, starty, newx, newy);
            startx = newx;
            starty = newy;

            //update the environment
            environment_nav2D.SetStart(startx, starty);

            //update the planner
            if (planner->set_start(solution_stateIDs_V[1]) == 0) {
                throw SBPL_Exception("ERROR: failed to update robot pose in the planner");
            }
        }

    }

    //print stats
    printf("stats: plantimes over 1 secs=%d; over 0.5 secs=%d; over 0.1 secs=%d; "
           "over 0.05 secs=%d; below 0.05 secs=%d\n",
           plantime_over1secs, plantime_over0p5secs, plantime_over0p1secs, plantime_over0p05secs,
           plantime_below0p05secs);
    fprintf(fSol, "stats: plantimes over 1 secs=%d; over 0.5; secs=%d; over 0.1 secs=%d; "
            "over 0.05 secs=%d; below 0.05 secs=%d\n",
            plantime_over1secs, plantime_over0p5secs, plantime_over0p1secs, plantime_over0p05secs,
            plantime_below0p05secs);

    if (bPrint) printf("System Pause (return=%d)\n", system("pause"));

    fflush(NULL);
    fclose(fSol);

    delete planner;

    return 1;
}